

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *privkey,ByteData *tweak)

{
  void *pvVar1;
  size_t sVar2;
  CfdException *pCVar3;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_work;
  undefined1 local_80 [36];
  int local_5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  if (this->secp256k1_context_ == (void *)0x0) {
    local_80._0_8_ = "cfdcore_secp256k1.cpp";
    local_80._8_4_ = 0xc2;
    local_80._16_8_ = "MulTweakPrivkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"Secp256k1 context is NULL.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Secp256k1 context is NULL.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(privkey);
  if (sVar2 != 0x20) {
    local_80._0_8_ = "cfdcore_secp256k1.cpp";
    local_80._8_4_ = 199;
    local_80._16_8_ = "MulTweakPrivkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"Invalid Argument privkey size."
                 );
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Invalid privkey size.","")
    ;
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(tweak);
  if (sVar2 != 0x20) {
    local_80._0_8_ = "cfdcore_secp256k1.cpp";
    local_80._8_4_ = 0xcc;
    local_80._16_8_ = "MulTweakPrivkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"Invalid Argument tweak size.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Invalid tweak size.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pvVar1 = this->secp256k1_context_;
  ByteData::GetBytes(&local_58,privkey);
  ByteData::GetBytes(&local_40,tweak);
  local_5c = secp256k1_ec_privkey_tweak_mul
                       (pvVar1,local_58.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                        local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  if (local_5c == 1) {
    ByteData::ByteData(__return_storage_ptr__,&local_58);
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_80._0_8_ = "cfdcore_secp256k1.cpp";
  local_80._8_4_ = 0xd9;
  local_80._16_8_ = "MulTweakPrivkeySecp256k1Ec";
  logger::log<int&>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,
                    "secp256k1_ec_privkey_tweak_mul Error.({})",&local_5c);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._0_8_ = local_80 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"Secp256k1 privkey tweak mul Error.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::MulTweakPrivkeySecp256k1Ec(
    const ByteData& privkey, const ByteData& tweak) {
  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (privkey.GetDataSize() != kPrivkeyByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument privkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid privkey size.");
  }
  if (tweak.GetDataSize() != kTweakByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument tweak size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid tweak size.");
  }

  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  std::vector<uint8_t> privkey_work = privkey.GetBytes();
  const std::vector<uint8_t>& tweak_byte = tweak.GetBytes();
  int ret = secp256k1_ec_privkey_tweak_mul(
      context, privkey_work.data(), tweak_byte.data());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_privkey_tweak_mul Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 privkey tweak mul Error.");
  }

  return ByteData(privkey_work);
}